

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O3

bool __thiscall DPlayerMenu::MenuEvent(DPlayerMenu *this,int mkey,bool fromcontroller)

{
  FListMenuDescriptor *pFVar1;
  FListMenuItem *li;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined8 *puVar5;
  uint uVar6;
  long lVar7;
  ECVarType type;
  uint green;
  char *pcVar8;
  uint red;
  char *val;
  UCVarValue value;
  DPlayerMenu *this_00;
  FIntCVar *this_01;
  int v;
  FName current;
  undefined1 local_28 [8];
  
  pFVar1 = (this->super_DListMenu).mDesc;
  lVar7 = (long)pFVar1->mSelectedItem;
  if (lVar7 < 0) {
LAB_003426a2:
    bVar3 = DListMenu::MenuEvent(&this->super_DListMenu,mkey,fromcontroller);
    return bVar3;
  }
  li = (pFVar1->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[lVar7];
  local_28 = (undefined1  [8])in_RAX;
  iVar4 = (*li->_vptr_FListMenuItem[0xd])(li,mkey,(ulong)fromcontroller);
  if ((char)iVar4 == '\0') goto LAB_003426a2;
  this_00 = (DPlayerMenu *)(local_28 + 4);
  (*li->_vptr_FListMenuItem[7])(this_00,li,0);
  switch(local_28._4_4_) {
  case 0x1e4:
    if (mkey == 10) {
      PlayerNameChanged(this_00,li);
    }
    break;
  case 0x1e5:
    iVar4 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_28);
    if ((char)iVar4 == '\0') {
      return true;
    }
    value = (UCVarValue)0xff;
    if (local_28._0_4_ != 0) {
      value._4_4_ = 0;
      value.Int = local_28._0_4_ - 1;
    }
    this_01 = &team;
    type = CVAR_Int;
    goto LAB_003428a3;
  case 0x1e6:
    ColorSetChanged(this,li);
    break;
  case 0x1e7:
    iVar4 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_28);
    if ((char)iVar4 == '\0') {
      return true;
    }
    puVar2 = (undefined8 *)
             ((ulong)(((&DAT_00a602d8)[(long)consoleplayer * 0xa8] - 1 & 0x1e6) * 0x18) +
             (&DAT_00a602c8)[(long)consoleplayer * 0x54]);
    do {
      puVar5 = puVar2;
      puVar2 = (undefined8 *)*puVar5;
    } while (*(int *)(puVar5 + 1) != 0x1e6);
    uVar6 = *(uint *)(puVar5[2] + 0x28);
    green = uVar6 >> 8 & 0xff;
    red = local_28._0_4_;
    goto LAB_00342820;
  case 0x1e8:
    iVar4 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_28);
    if ((char)iVar4 == '\0') {
      return true;
    }
    puVar2 = (undefined8 *)
             ((ulong)(((&DAT_00a602d8)[(long)consoleplayer * 0xa8] - 1 & 0x1e6) * 0x18) +
             (&DAT_00a602c8)[(long)consoleplayer * 0x54]);
    do {
      puVar5 = puVar2;
      puVar2 = (undefined8 *)*puVar5;
    } while (*(int *)(puVar5 + 1) != 0x1e6);
    uVar6 = *(uint *)(puVar5[2] + 0x28);
    red = uVar6 >> 0x10 & 0xff;
    green = local_28._0_4_;
LAB_00342820:
    local_28._0_4_ = uVar6 & 0xff;
LAB_00342918:
    SendNewColor(this,red,green,local_28._0_4_);
    break;
  case 0x1e9:
    iVar4 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_28);
    if ((char)iVar4 == '\0') {
      return true;
    }
    puVar2 = (undefined8 *)
             ((ulong)(((&DAT_00a602d8)[(long)consoleplayer * 0xa8] - 1 & 0x1e6) * 0x18) +
             (&DAT_00a602c8)[(long)consoleplayer * 0x54]);
    do {
      puVar5 = puVar2;
      puVar2 = (undefined8 *)*puVar5;
    } while (*(int *)(puVar5 + 1) != 0x1e6);
    red = *(uint *)(puVar5[2] + 0x28) >> 0x10 & 0xff;
    green = *(uint *)(puVar5[2] + 0x28) >> 8 & 0xff;
    goto LAB_00342918;
  case 0x1ea:
    SkinChanged(this,li);
    break;
  case 0x1eb:
    iVar4 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_28);
    if ((char)iVar4 != '\0') {
      pcVar8 = "other";
      if (local_28._0_4_ == 1) {
        pcVar8 = "female";
      }
      val = "male";
      if (local_28._0_4_ != 0) {
        val = pcVar8;
      }
      cvar_set("gender",val);
    }
    break;
  case 0x1ec:
    AutoaimChanged(this_00,li);
    break;
  case 0x1ed:
    iVar4 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_28);
    if ((char)iVar4 == '\0') {
      return true;
    }
    this_01 = (FIntCVar *)&neverswitchonpickup;
    goto LAB_0034278f;
  default:
    if (local_28._4_4_ == 5) {
      ClassChanged(this,li);
      return true;
    }
    if (local_28._4_4_ != 0x20f) {
      return true;
    }
    iVar4 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_28);
    if ((char)iVar4 == '\0') {
      return true;
    }
    this_01 = (FIntCVar *)&cl_run;
LAB_0034278f:
    value._1_7_ = 0;
    value.Bool = local_28._0_4_ != 0;
    type = CVAR_Bool;
LAB_003428a3:
    FBaseCVar::SetGenericRep(&this_01->super_FBaseCVar,value,type);
  }
  return true;
}

Assistant:

bool DPlayerMenu::MenuEvent (int mkey, bool fromcontroller)
{
	int v;
	if (mDesc->mSelectedItem >= 0)
	{
		FListMenuItem *li = mDesc->mItems[mDesc->mSelectedItem];
		if (li->MenuEvent(mkey, fromcontroller))
		{
			FName current = li->GetAction(NULL);
			switch(current)
			{
				// item specific handling comes here

			case NAME_Playerbox:
				if (mkey == MKEY_Input)
				{
					PlayerNameChanged(li);
				}
				break;

			case NAME_Team:
				if (li->GetValue(0, &v))
				{
					team = v==0? TEAM_NONE : v-1;
				}
				break;

			case NAME_Color:
					ColorSetChanged(li);
					break;

			case NAME_Red:
				if (li->GetValue(0, &v))
				{
					uint32 color = players[consoleplayer].userinfo.GetColor();
					SendNewColor (v, GPART(color), BPART(color));
				}
				break;

			case NAME_Green:
				if (li->GetValue(0, &v))
				{
					uint32 color = players[consoleplayer].userinfo.GetColor();
					SendNewColor (RPART(color), v, BPART(color));
				}
				break;

			case NAME_Blue:
				if (li->GetValue(0, &v))
				{
					uint32 color = players[consoleplayer].userinfo.GetColor();
					SendNewColor (RPART(color), GPART(color), v);
				}
				break;

			case NAME_Class:
				ClassChanged(li);
				break;

			case NAME_Skin:
				SkinChanged(li);
				break;

			case NAME_Gender:
				if (li->GetValue(0, &v))
				{
					cvar_set ("gender", v==0? "male" : v==1? "female" : "other");
				}
				break;

			case NAME_Autoaim:
				AutoaimChanged(li);
				break;

			case NAME_Switch:
				if (li->GetValue(0, &v))
				{
					neverswitchonpickup = !!v;
				}
				break;

			case NAME_AlwaysRun:
				if (li->GetValue(0, &v))
				{
					cl_run = !!v;
				}
				break;

			default:
				break;
			}
			return true;
		}
	}
	return Super::MenuEvent(mkey, fromcontroller);
}